

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

uint32_t __thiscall Catch::TestCaseInfoHasher::operator()(TestCaseInfoHasher *this,TestCaseInfo *t)

{
  ulong uVar1;
  long lVar2;
  Tag *tag;
  pointer pTVar3;
  size_type sVar4;
  size_type sVar5;
  
  uVar1 = 0xcbf29ce484222325;
  for (sVar4 = 0; (t->name)._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    uVar1 = (uVar1 ^ (long)(t->name)._M_dataplus._M_p[sVar4]) * 0x100000001b3;
  }
  for (sVar5 = 0; (t->className).m_size != sVar5; sVar5 = sVar5 + 1) {
    uVar1 = (uVar1 ^ (long)(t->className).m_start[sVar5]) * 0x100000001b3;
  }
  for (pTVar3 = (t->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar3 != (t->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
    for (sVar5 = 0; (pTVar3->original).m_size != sVar5; sVar5 = sVar5 + 1) {
      uVar1 = (uVar1 ^ (long)(pTVar3->original).m_start[sVar5]) * 0x100000001b3;
    }
  }
  lVar2 = (uVar1 ^ this->m_seed) * 0x100000001b3;
  return (int)((ulong)lVar2 >> 0x20) * (int)lVar2;
}

Assistant:

uint32_t TestCaseInfoHasher::operator()( TestCaseInfo const& t ) const {
        // FNV-1a hash algorithm that is designed for uniqueness:
        const hash_t prime = 1099511628211u;
        hash_t hash = 14695981039346656037u;
        for ( const char c : t.name ) {
            hash ^= c;
            hash *= prime;
        }
        for ( const char c : t.className ) {
            hash ^= c;
            hash *= prime;
        }
        for ( const Tag& tag : t.tags ) {
            for ( const char c : tag.original ) {
                hash ^= c;
                hash *= prime;
            }
        }
        hash ^= m_seed;
        hash *= prime;
        const uint32_t low{ static_cast<uint32_t>( hash ) };
        const uint32_t high{ static_cast<uint32_t>( hash >> 32 ) };
        return low * high;
    }